

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
insert(storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag> *this,
      local_context *ctx,bit_array *x,size_t hash,int remaining_constraints,double duration,
      long loop)

{
  int id;
  result_type_conflict1 rVar1;
  double value;
  string_view fmt;
  string_view fmt_00;
  double *in_stack_ffffffffffffffa8;
  int id_to_delete;
  int remaining_constraints_local;
  long loop_local;
  double duration_local;
  size_t hash_local;
  
  fmt._M_str = (char *)&remaining_constraints_local;
  fmt._M_len = (size_t)"- insert advance {} (hash: {}) {}s in {} loops\n";
  remaining_constraints_local = remaining_constraints;
  loop_local = loop;
  duration_local = duration;
  hash_local = hash;
  to_log<int,unsigned_long,double,long>
            (_stdout,(FILE *)0x5,0x2f,fmt,(int *)&hash_local,(unsigned_long *)&duration_local,
             (double *)&loop_local,(long *)in_stack_ffffffffffffffa8);
  rVar1 = std::uniform_int_distribution<int>::operator()(&ctx->bad_solution_choose,&ctx->rng);
  id_to_delete = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[rVar1];
  fmt_00._M_str = (char *)&id_to_delete;
  fmt_00._M_len = (size_t)"- delete {} ({})\n";
  to_log<int,double>(_stdout,(FILE *)0x5,0x11,fmt_00,
                     (int *)&(this->m_data).
                             super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[id_to_delete].value,
                     in_stack_ffffffffffffffa8);
  id = id_to_delete;
  value = default_cost_type<long_double>::results(this->costs,x,this->cost_constant);
  replace_result(this,id,x,value,duration_local,hash_local,loop_local,remaining_constraints_local);
  sort(this);
  return;
}

Assistant:

void insert(local_context& ctx,
                const bit_array& x,
                const std::size_t hash,
                const int remaining_constraints,
                const double duration,
                const long int loop) noexcept
    {
        to_log(stdout,
               5u,
               "- insert advance {} (hash: {}) {}s in {} loops\n",
               remaining_constraints,
               hash,
               duration,
               loop);

        int id_to_delete = m_indices[choose_a_bad_solution(ctx)];

        to_log(stdout,
               5u,
               "- delete {} ({})\n",
               id_to_delete,
               m_data[id_to_delete].value);

        replace_result(id_to_delete,
                       x,
                       costs.results(x, cost_constant),
                       duration,
                       hash,
                       loop,
                       remaining_constraints);

        sort();
    }